

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,
          bool excludeGuardPages)

{
  HANDLE pVVar1;
  char *lpAddress;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar6;
  undefined4 *puVar7;
  HANDLE pVVar8;
  DWORD local_24;
  BOOL vpresult;
  DWORD oldProtect;
  bool excludeGuardPages_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPStack_18;
  DWORD allocFlags_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  uVar4 = this->freePageCount;
  vpresult._3_1_ = excludeGuardPages;
  oldProtect = allocFlags;
  pPStack_18 = this;
  pPVar6 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
  if (((ulong)(uVar4 + pPVar6->secondaryAllocPageCount) !=
       (this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount) &&
     (this->freePageCount != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x111,
                       "(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0)"
                       ,
                       "freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = SegmentBase<Memory::VirtualAllocWrapper>::Initialize
                    (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,oldProtect,
                     (bool)(vpresult._3_1_ & 1));
  if (bVar3) {
    if (this->freePageCount != 0) {
      pPVar6 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                         (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
      pVVar1 = pPVar6->processHandle;
      pVVar8 = GetCurrentProcess();
      if (pVVar1 == pVVar8) {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
        uVar4 = GetAvailablePageCount(this);
        BVar5 = VirtualProtect(lpAddress,(ulong)(uVar4 << 0xc),1,&local_24);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x11c,"((0))","UNREACHED");
          if (bVar3) {
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
            return false;
          }
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        if (local_24 != 4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x11f,"(oldProtect == 0x04)","oldProtect == PAGE_READWRITE");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
PageSegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0);
    if (__super::Initialize(allocFlags, excludeGuardPages))
    {
        if (freePageCount != 0)
        {
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(this->address, this->GetAvailablePageCount() * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
                if(vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return false;
                }
                Assert(oldProtect == PAGE_READWRITE);
            }
        }
        return true;
    }
    return false;
}